

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O0

CURLcode cw_out_ptr_flush(cw_out_ctx *ctx,Curl_easy *data,cw_out_type otype,_Bool flush_all,
                         char *buf,size_t blen,size_t *pconsumed)

{
  curl_write_callback p_Var1;
  char *pcVar2;
  bool bVar3;
  curl_write_callback local_80;
  curl_write_callback local_78;
  size_t nwritten;
  size_t wlen;
  size_t min_write;
  size_t max_write;
  void *wcb_data;
  curl_write_callback wcb;
  size_t blen_local;
  char *buf_local;
  _Bool flush_all_local;
  Curl_easy *pCStack_20;
  cw_out_type otype_local;
  Curl_easy *data_local;
  cw_out_ctx *ctx_local;
  
  if (((byte)ctx->field_0x28 >> 1 & 1) == 0) {
    wcb = (curl_write_callback)blen;
    blen_local = (size_t)buf;
    buf_local._3_1_ = flush_all;
    buf_local._4_4_ = otype;
    pCStack_20 = data;
    data_local = (Curl_easy *)ctx;
    cw_get_writefunc(data,otype,(curl_write_callback *)&wcb_data,(void **)&max_write,&min_write,
                     &wlen);
    if (wcb_data != (void *)0x0) {
      *pconsumed = 0;
      while( true ) {
        bVar3 = false;
        if (wcb != (curl_write_callback)0x0) {
          bVar3 = ((ulong)(data_local->multi_queue)._ptr & 1) == 0;
        }
        if ((!bVar3) || (((buf_local._3_1_ & 1) == 0 && (wcb < wlen)))) {
          return CURLE_OK;
        }
        if (min_write == 0) {
          local_80 = wcb;
        }
        else {
          if (wcb < min_write) {
            local_78 = wcb;
          }
          else {
            local_78 = (curl_write_callback)min_write;
          }
          local_80 = local_78;
        }
        Curl_set_in_callback(pCStack_20,true);
        p_Var1 = (curl_write_callback)(*(code *)wcb_data)(blen_local,1,local_80,max_write);
        Curl_set_in_callback(pCStack_20,false);
        if ((((pCStack_20 != (Curl_easy *)0x0) &&
             ((*(ulong *)&(pCStack_20->set).field_0x8ca >> 0x1c & 1) != 0)) &&
            (((pCStack_20->state).feat == (curl_trc_feat *)0x0 ||
             (0 < ((pCStack_20->state).feat)->log_level)))) && (0 < Curl_trc_feat_write.log_level))
        {
          pcVar2 = "header";
          if (buf_local._4_4_ == CW_OUT_BODY) {
            pcVar2 = "body";
          }
          Curl_trc_write(pCStack_20,"cw_out, wrote %zu %s bytes -> %zu",local_80,pcVar2,p_Var1);
        }
        if (p_Var1 == (curl_write_callback)0x10000001) break;
        if (p_Var1 == (curl_write_callback)0xffffffff) {
          Curl_failf(pCStack_20,"client returned ERROR on write of %zu bytes",local_80);
          return CURLE_WRITE_ERROR;
        }
        if (p_Var1 != local_80) {
          Curl_failf(pCStack_20,"Failure writing output to destination, passed %zu returned %zd",
                     local_80,p_Var1);
          return CURLE_WRITE_ERROR;
        }
        *pconsumed = (size_t)(p_Var1 + *pconsumed);
        wcb = wcb + -(long)p_Var1;
        blen_local = (size_t)(p_Var1 + blen_local);
      }
      if ((pCStack_20->conn != (connectdata *)0x0) &&
         ((pCStack_20->conn->handler->flags & 0x10) != 0)) {
        Curl_failf(pCStack_20,"Write callback asked for PAUSE when not supported");
        return CURLE_WRITE_ERROR;
      }
      (pCStack_20->req).keepon = (pCStack_20->req).keepon | 0x10;
      *(byte *)&(data_local->multi_queue)._ptr = *(byte *)&(data_local->multi_queue)._ptr & 0xfe | 1
      ;
      if (pCStack_20 == (Curl_easy *)0x0) {
        return CURLE_OK;
      }
      if ((*(ulong *)&(pCStack_20->set).field_0x8ca >> 0x1c & 1) == 0) {
        return CURLE_OK;
      }
      if (((pCStack_20->state).feat != (curl_trc_feat *)0x0) &&
         (((pCStack_20->state).feat)->log_level < 1)) {
        return CURLE_OK;
      }
      if (Curl_trc_feat_write.log_level < 1) {
        return CURLE_OK;
      }
      Curl_trc_write(pCStack_20,"cw_out, PAUSE requested by client");
      return CURLE_OK;
    }
    *pconsumed = (size_t)wcb;
    ctx_local._4_4_ = CURLE_OK;
  }
  else {
    ctx_local._4_4_ = CURLE_WRITE_ERROR;
  }
  return ctx_local._4_4_;
}

Assistant:

static CURLcode cw_out_ptr_flush(struct cw_out_ctx *ctx,
                                 struct Curl_easy *data,
                                 cw_out_type otype,
                                 bool flush_all,
                                 const char *buf, size_t blen,
                                 size_t *pconsumed)
{
  curl_write_callback wcb;
  void *wcb_data;
  size_t max_write, min_write;
  size_t wlen, nwritten;

  /* If we errored once, we do not invoke the client callback  again */
  if(ctx->errored)
    return CURLE_WRITE_ERROR;

  /* write callbacks may get NULLed by the client between calls. */
  cw_get_writefunc(data, otype, &wcb, &wcb_data, &max_write, &min_write);
  if(!wcb) {
    *pconsumed = blen;
    return CURLE_OK;
  }

  *pconsumed = 0;
  while(blen && !ctx->paused) {
    if(!flush_all && blen < min_write)
      break;
    wlen = max_write ? CURLMIN(blen, max_write) : blen;
    Curl_set_in_callback(data, TRUE);
    nwritten = wcb((char *)buf, 1, wlen, wcb_data);
    Curl_set_in_callback(data, FALSE);
    CURL_TRC_WRITE(data, "cw_out, wrote %zu %s bytes -> %zu",
                   wlen, (otype == CW_OUT_BODY) ? "body" : "header",
                   nwritten);
    if(CURL_WRITEFUNC_PAUSE == nwritten) {
      if(data->conn && data->conn->handler->flags & PROTOPT_NONETWORK) {
        /* Protocols that work without network cannot be paused. This is
           actually only FILE:// just now, and it cannot pause since the
           transfer is not done using the "normal" procedure. */
        failf(data, "Write callback asked for PAUSE when not supported");
        return CURLE_WRITE_ERROR;
      }
      /* mark the connection as RECV paused */
      data->req.keepon |= KEEP_RECV_PAUSE;
      ctx->paused = TRUE;
      CURL_TRC_WRITE(data, "cw_out, PAUSE requested by client");
      break;
    }
    else if(CURL_WRITEFUNC_ERROR == nwritten) {
      failf(data, "client returned ERROR on write of %zu bytes", wlen);
      return CURLE_WRITE_ERROR;
    }
    else if(nwritten != wlen) {
      failf(data, "Failure writing output to destination, "
            "passed %zu returned %zd", wlen, nwritten);
      return CURLE_WRITE_ERROR;
    }
    *pconsumed += nwritten;
    blen -= nwritten;
    buf += nwritten;
  }
  return CURLE_OK;
}